

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::OperatorPerformanceCase
          (OperatorPerformanceCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,CaseType caseType,int numWorkloads,
          InitialCalibrationStorage *initialCalibrationStorage)

{
  int iVar1;
  CommandLine *cmdLine;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_bc;
  int local_9c;
  CaseType caseType_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  OperatorPerformanceCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__OperatorPerformanceCase_03292cf8;
  this->m_renderCtx = renderCtx;
  this->m_caseType = caseType;
  cmdLine = tcu::TestContext::getCommandLine((this->super_TestCase).super_TestNode.m_testCtx);
  iVar1 = getIterationCountOrDefault(cmdLine,3);
  this->m_numMeasurementsPerWorkload = iVar1;
  this->m_numWorkloads = numWorkloads;
  this->m_workloadNdx = -1;
  this->m_workloadMeasurementNdx = -1;
  std::
  vector<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ::vector(&this->m_workloadRecordsFindHigh);
  std::
  vector<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ::vector(&this->m_workloadRecords);
  this->m_state = STATE_LAST;
  this->m_measureProgramNdx = -1;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_highWorkloadSizes);
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator(&this->m_calibrator);
  de::
  SharedPtr<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  ::SharedPtr(&this->m_initialCalibrationStorage,initialCalibrationStorage);
  if (caseType == CASETYPE_VERTEX) {
    local_9c = 0x20;
  }
  else {
    iVar1 = (*renderCtx->_vptr_RenderContext[4])();
    local_9c = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  }
  this->m_viewportWidth = local_9c;
  if (caseType == CASETYPE_VERTEX) {
    local_bc = 0x20;
  }
  else {
    iVar1 = (*renderCtx->_vptr_RenderContext[4])();
    local_bc = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  }
  this->m_viewportHeight = local_bc;
  iVar1 = 100;
  if (caseType == CASETYPE_FRAGMENT) {
    iVar1 = 1;
  }
  this->m_gridSizeX = iVar1;
  iVar1 = 100;
  if (caseType == CASETYPE_FRAGMENT) {
    iVar1 = 1;
  }
  this->m_gridSizeY = iVar1;
  std::
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  ::vector(&this->m_programData);
  std::
  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>::
  vector(&this->m_programs);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_attribBuffers);
  return;
}

Assistant:

OperatorPerformanceCase::OperatorPerformanceCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description,
												  CaseType caseType, int numWorkloads, const InitialCalibrationStorage& initialCalibrationStorage)
	: tcu::TestCase					(testCtx, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_renderCtx					(renderCtx)
	, m_caseType					(caseType)
	, m_numMeasurementsPerWorkload	(getIterationCountOrDefault(m_testCtx.getCommandLine(), DEFAULT_NUM_MEASUREMENTS_PER_WORKLOAD))
	, m_numWorkloads				(numWorkloads)
	, m_workloadNdx					(-1)
	, m_workloadMeasurementNdx		(-1)
	, m_state						(STATE_LAST)
	, m_measureProgramNdx			(-1)
	, m_initialCalibrationStorage	(initialCalibrationStorage)
	, m_viewportWidth				(caseType == CASETYPE_VERTEX	? 32	: renderCtx.getRenderTarget().getWidth())
	, m_viewportHeight				(caseType == CASETYPE_VERTEX	? 32	: renderCtx.getRenderTarget().getHeight())
	, m_gridSizeX					(caseType == CASETYPE_FRAGMENT	? 1		: 100)
	, m_gridSizeY					(caseType == CASETYPE_FRAGMENT	? 1		: 100)
{
	DE_ASSERT(m_numWorkloads > 0);
}